

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64InstPrinter.c
# Opt level: O3

void printTypedVectorList
               (MCInst *MI,uint OpNum,SStream *O,uint NumLanes,char LaneKind,MCRegisterInfo *MRI)

{
  uint8_t *puVar1;
  cs_detail *pcVar2;
  _Bool _Var3;
  uint uVar4;
  uint Reg;
  uint uVar5;
  arm64_reg aVar6;
  MCOperand *op;
  MCRegisterClass *pMVar7;
  int iVar8;
  undefined3 in_register_00000081;
  char Suffix [32];
  int local_68;
  undefined4 local_64;
  char local_58 [40];
  
  if (NumLanes == 0) {
    local_68 = 0;
    cs_snprintf(local_58,0x20,".%c",(ulong)CONCAT31(in_register_00000081,LaneKind));
    if (LaneKind < 'h') {
      if (LaneKind == 'b') {
        local_64 = 1;
      }
      else if (LaneKind == 'd') {
        local_64 = 4;
      }
      else {
LAB_001828ad:
        local_64 = 0;
      }
    }
    else if (LaneKind == 'h') {
      local_64 = 2;
    }
    else {
      if (LaneKind != 's') goto LAB_001828ad;
      local_64 = 3;
    }
  }
  else {
    local_64 = 0;
    cs_snprintf(local_58,0x20,".%u%c");
    if (LaneKind < 'h') {
      if (LaneKind == 'b') {
        if (NumLanes == 0x10) {
          local_68 = 2;
        }
        else {
          if (NumLanes != 8) goto LAB_001828a4;
          local_68 = 1;
        }
      }
      else if (LaneKind == 'd') {
        if (NumLanes == 2) {
          local_68 = 8;
        }
        else {
          if (NumLanes != 1) goto LAB_001828a4;
          local_68 = 7;
        }
      }
      else {
LAB_001828a4:
        local_68 = 0;
      }
    }
    else if (LaneKind == 'h') {
      if (NumLanes == 8) {
        local_68 = 4;
      }
      else {
        if (NumLanes != 4) goto LAB_001828a4;
        local_68 = 3;
      }
    }
    else if (LaneKind == 'q') {
      local_68 = (uint)(NumLanes == 1) * 9;
    }
    else {
      if (LaneKind != 's') goto LAB_001828a4;
      if (NumLanes == 4) {
        local_68 = 6;
      }
      else {
        if (NumLanes != 2) goto LAB_001828a4;
        local_68 = 5;
      }
    }
  }
  op = MCInst_getOperand(MI,OpNum);
  uVar4 = MCOperand_getReg(op);
  SStream_concat0(O,"{");
  pMVar7 = MCRegisterInfo_getRegClass(MRI,0x10);
  _Var3 = MCRegisterClass_contains(pMVar7,uVar4);
  iVar8 = 2;
  if (!_Var3) {
    pMVar7 = MCRegisterInfo_getRegClass(MRI,0x15);
    _Var3 = MCRegisterClass_contains(pMVar7,uVar4);
    if (!_Var3) {
      pMVar7 = MCRegisterInfo_getRegClass(MRI,0x13);
      _Var3 = MCRegisterClass_contains(pMVar7,uVar4);
      iVar8 = 3;
      if (!_Var3) {
        pMVar7 = MCRegisterInfo_getRegClass(MRI,0x19);
        _Var3 = MCRegisterClass_contains(pMVar7,uVar4);
        if (!_Var3) {
          pMVar7 = MCRegisterInfo_getRegClass(MRI,0x14);
          _Var3 = MCRegisterClass_contains(pMVar7,uVar4);
          if (!_Var3) {
            pMVar7 = MCRegisterInfo_getRegClass(MRI,0x20);
            _Var3 = MCRegisterClass_contains(pMVar7,uVar4);
            iVar8 = 1;
            if (!_Var3) goto LAB_001829d3;
          }
          iVar8 = 4;
        }
      }
    }
  }
LAB_001829d3:
  Reg = MCRegisterInfo_getSubReg(MRI,uVar4,3);
  if ((Reg == 0) && (uVar5 = MCRegisterInfo_getSubReg(MRI,uVar4,10), Reg = uVar4, uVar5 != 0)) {
    Reg = uVar5;
  }
  pMVar7 = MCRegisterInfo_getRegClass(MRI,10);
  _Var3 = MCRegisterClass_contains(pMVar7,Reg);
  if (_Var3) {
    pMVar7 = MCRegisterInfo_getRegClass(MRI,0x11);
    Reg = MCRegisterInfo_getMatchingSuperReg(MRI,Reg,2,pMVar7);
  }
  do {
    SStream_concat(O,"%s%s",getRegisterName_AsmStrsvreg +
                            *(uint *)(getRegisterName_RegAsmOffsetvreg + (ulong)(Reg - 1) * 4),
                   local_58);
    if (iVar8 != 1) {
      SStream_concat0(O,", ");
    }
    if (MI->csh->detail != CS_OPT_OFF) {
      pcVar2 = MI->flat_insn->detail;
      puVar1 = pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x2e;
      puVar1[0] = '\x01';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      aVar6 = AArch64_map_vregister(Reg);
      pcVar2 = MI->flat_insn->detail;
      *(arm64_reg *)(pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x36)
           = aVar6;
      pcVar2 = MI->flat_insn->detail;
      *(int *)(pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x1a) =
           local_68;
      pcVar2 = MI->flat_insn->detail;
      *(undefined4 *)(pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x1e)
           = local_64;
      puVar1 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
      *puVar1 = *puVar1 + '\x01';
    }
    uVar4 = Reg - 0x69;
    Reg = 0x69;
    if (uVar4 < 0x1f) {
      Reg = *(uint *)(&DAT_001dea2c + (ulong)uVar4 * 4);
    }
    iVar8 = iVar8 + -1;
  } while (iVar8 != 0);
  SStream_concat0(O,"}");
  return;
}

Assistant:

static void printTypedVectorList(MCInst *MI, unsigned OpNum, SStream *O, unsigned NumLanes, char LaneKind, MCRegisterInfo *MRI)
{
	char Suffix[32];
	arm64_vas vas = 0;
	arm64_vess vess = 0;

	if (NumLanes) {
		cs_snprintf(Suffix, sizeof(Suffix), ".%u%c", NumLanes, LaneKind);
		switch(LaneKind) {
			default: break;
			case 'b':
				switch(NumLanes) {
					default: break;
					case 8:
							 vas = ARM64_VAS_8B;
							 break;
					case 16:
							 vas = ARM64_VAS_16B;
							 break;
				}
				break;
			case 'h':
				switch(NumLanes) {
					default: break;
					case 4:
							 vas = ARM64_VAS_4H;
							 break;
					case 8:
							 vas = ARM64_VAS_8H;
							 break;
				}
				break;
			case 's':
				switch(NumLanes) {
					default: break;
					case 2:
							 vas = ARM64_VAS_2S;
							 break;
					case 4:
							 vas = ARM64_VAS_4S;
							 break;
				}
				break;
			case 'd':
				switch(NumLanes) {
					default: break;
					case 1:
							 vas = ARM64_VAS_1D;
							 break;
					case 2:
							 vas = ARM64_VAS_2D;
							 break;
				}
				break;
			case 'q':
				switch(NumLanes) {
					default: break;
					case 1:
							 vas = ARM64_VAS_1Q;
							 break;
				}
				break;
		}
	} else {
		cs_snprintf(Suffix, sizeof(Suffix), ".%c", LaneKind);
		switch(LaneKind) {
			default: break;
			case 'b':
					 vess = ARM64_VESS_B;
					 break;
			case 'h':
					 vess = ARM64_VESS_H;
					 break;
			case 's':
					 vess = ARM64_VESS_S;
					 break;
			case 'd':
					 vess = ARM64_VESS_D;
					 break;
		}
	}

	printVectorList(MI, OpNum, O, Suffix, MRI, vas, vess);
}